

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

void __thiscall flatbuffers::Parser::Next(Parser *this)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  byte *extraout_RAX;
  long *plVar7;
  undefined8 extraout_RAX_00;
  size_type *psVar8;
  uint uVar9;
  char *pcVar10;
  char cVar11;
  uint *puVar12;
  byte *pbVar13;
  byte *pbVar14;
  string ch;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (this->doc_comment_)._M_string_length = 0;
  *(this->doc_comment_)._M_dataplus._M_p = '\0';
  paVar1 = &local_90.field_2;
  bVar4 = false;
  puVar12 = &switchD_0010a671::switchdataD_00116010;
LAB_0010a627:
  do {
    pbVar14 = (byte *)this->cursor_;
switchD_0010a671_caseD_20:
    do {
      pbVar13 = pbVar14;
      pbVar14 = pbVar13 + 1;
      this->cursor_ = (char *)pbVar14;
      bVar5 = *pbVar13;
      uVar9 = (uint)bVar5;
      this->token_ = (int)(char)bVar5;
      if (0x1f < uVar9) {
        if (0x39 < uVar9) {
          if ((uVar9 - 0x3a < 0x24) && ((0xa0000000bU >> ((ulong)(uVar9 - 0x3a) & 0x3f) & 1) != 0))
          {
            return;
          }
          if (uVar9 == 0x7b) {
            return;
          }
          if (uVar9 == 0x7d) {
            return;
          }
          goto switchD_0010a671_caseD_21;
        }
        switch(uVar9) {
        case 0x20:
          break;
        default:
          goto switchD_0010a671_caseD_21;
        case 0x22:
          std::__cxx11::string::_M_replace
                    ((ulong)&this->attribute_,0,(char *)(this->attribute_)._M_string_length,0x116c91
                    );
          goto LAB_0010aa63;
        case 0x28:
        case 0x29:
        case 0x2c:
          goto switchD_0010a671_caseD_28;
        case 0x2e:
          if (9 < (int)(char)*pbVar14 - 0x30U) {
            return;
          }
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"floating point constant can\'t start with \".\"","");
          Error(&local_90);
          pbVar14 = extraout_RAX;
          goto LAB_0010ab4a;
        case 0x2f:
          if (*pbVar14 != 0x2f) goto switchD_0010a671_caseD_21;
          pbVar14 = pbVar13 + 2;
          while( true ) {
            this->cursor_ = (char *)pbVar14;
            if ((*pbVar14 == 0) || (*pbVar14 == 10)) break;
            pbVar14 = pbVar14 + 1;
          }
          if (pbVar13[2] == 0x2f) {
            pcVar10 = (char *)paVar1;
            if (!bVar4) goto LAB_0010adfc;
            local_90._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pbVar13 + 3,pbVar14)
            ;
            std::__cxx11::string::_M_append
                      ((char *)&this->doc_comment_,(ulong)local_90._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar1) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            bVar4 = true;
            goto LAB_0010a627;
          }
        }
        goto switchD_0010a671_caseD_20;
      }
      if (uVar9 < 10) {
        if (uVar9 != 9) {
          if (bVar5 == 0) {
            this->cursor_ = (char *)pbVar13;
            this->token_ = 0;
            return;
          }
          goto switchD_0010a671_caseD_21;
        }
        goto switchD_0010a671_caseD_20;
      }
    } while (uVar9 == 0xd);
    if (uVar9 != 10) {
switchD_0010a671_caseD_21:
      iVar6 = isalpha(uVar9);
      if (iVar6 != 0) {
        bVar5 = *pbVar14;
        iVar6 = isalnum((uint)bVar5);
        if ((bVar5 == 0x5f) || (iVar6 != 0)) {
          pbVar14 = pbVar13 + 2;
          do {
            do {
              this->cursor_ = (char *)pbVar14;
              bVar5 = *pbVar14;
              iVar6 = isalnum((uint)bVar5);
              pbVar14 = pbVar14 + 1;
            } while (bVar5 == 0x5f);
          } while (iVar6 != 0);
        }
        this_00 = &this->attribute_;
        (this->attribute_)._M_string_length = 0;
        *(this->attribute_)._M_dataplus._M_p = '\0';
        std::__cxx11::string::replace
                  ((ulong)this_00,(this->attribute_)._M_string_length,(char *)0x0,(ulong)pbVar13);
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0xb;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0xc;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0xd;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0xe;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0xf;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x10;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x11;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x12;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x13;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x14;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x15;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x16;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x17;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x18;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x19;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x1a;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 0x1b;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)this_00), iVar6 == 0)) {
          iVar6 = std::__cxx11::string::compare((char *)this_00);
          NumToString<bool>(&local_90,iVar6 == 0);
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          this->token_ = 2;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 5;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 6;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 == 0) {
          this->token_ = 7;
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)this_00);
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare((char *)this_00);
          if (iVar6 == 0) {
            this->token_ = 9;
            return;
          }
          iVar6 = std::__cxx11::string::compare((char *)this_00);
          if (iVar6 != 0) {
            this->token_ = 4;
            return;
          }
          this->token_ = 10;
          return;
        }
        goto LAB_0010adaa;
      }
      puVar12 = (uint *)paVar1;
      if (uVar9 == 0x2d || uVar9 - 0x30 < 10) {
        bVar5 = *pbVar14;
        if (bVar5 - 0x30 < 10) {
          pbVar3 = pbVar13 + 2;
          do {
            pbVar14 = pbVar3;
            this->cursor_ = (char *)pbVar14;
            bVar5 = *pbVar14;
            pbVar3 = pbVar14 + 1;
          } while (bVar5 - 0x30 < 10);
        }
        iVar6 = 2;
        if (bVar5 == 0x2e) {
          do {
            pbVar14 = pbVar14 + 1;
            this->cursor_ = (char *)pbVar14;
          } while (*pbVar14 - 0x30 < 10);
          iVar6 = 3;
        }
        this->token_ = iVar6;
        (this->attribute_)._M_string_length = 0;
        *(this->attribute_)._M_dataplus._M_p = '\0';
        std::__cxx11::string::replace
                  ((ulong)&this->attribute_,(this->attribute_)._M_string_length,(char *)0x0,
                   (ulong)pbVar13);
        return;
      }
      goto LAB_0010ae24;
    }
    this->line_ = this->line_ + 1;
    bVar4 = true;
  } while( true );
LAB_0010aa63:
  pbVar14 = (byte *)this->cursor_;
  do {
    bVar2 = *pbVar14;
    if (bVar2 == 0x22) {
LAB_0010ab4a:
      this->cursor_ = (char *)(pbVar14 + 1);
      this->token_ = 1;
switchD_0010a671_caseD_28:
      return;
    }
    if (bVar2 < 0x20) {
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"illegal character in string constant","");
      Error(&local_90);
LAB_0010adaa:
      this->token_ = 8;
      return;
    }
    this->cursor_ = (char *)(pbVar14 + 1);
    cVar11 = (char)&this->attribute_;
    if (bVar2 != 0x5c) break;
    bVar2 = pbVar14[1];
    if (bVar2 < 0x6e) {
      if ((bVar2 != 0x22) && (bVar2 != 0x5c)) goto LAB_0010add7;
    }
    else if ((bVar2 != 0x74) && ((bVar2 != 0x72 && (bVar2 != 0x6e)))) {
LAB_0010add7:
      pcVar10 = "unknown escape code in string constant";
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"unknown escape code in string constant","");
      Error(&local_90);
LAB_0010adfc:
      local_90._M_dataplus._M_p = pcVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"a documentation comment should be on a line on its own","");
      Error(&local_90);
LAB_0010ae24:
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)puVar12;
      std::__cxx11::string::_M_replace_aux((ulong)&local_90,0,0,'\x01');
      if ((byte)(bVar5 + 0x81) < 0xa1) {
        NumToString<char>(&local_50,bVar5);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1162c5);
        local_70._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_70._M_dataplus._M_p == psVar8) {
          local_70.field_2._M_allocated_capacity = *psVar8;
          local_70.field_2._8_8_ = plVar7[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar8;
        }
        local_70._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      std::operator+(&local_70,"illegal character: ",&local_90);
      Error(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((uint *)local_90._M_dataplus._M_p != puVar12) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      _Unwind_Resume(extraout_RAX_00);
    }
    std::__cxx11::string::push_back(cVar11);
    pbVar14 = (byte *)(this->cursor_ + 1);
    this->cursor_ = (char *)pbVar14;
  } while( true );
  std::__cxx11::string::push_back(cVar11);
  goto LAB_0010aa63;
}

Assistant:

void Parser::Next() {
  doc_comment_.clear();
  bool seen_newline = false;
  for (;;) {
    char c = *cursor_++;
    token_ = c;
    switch (c) {
      case '\0': cursor_--; token_ = kTokenEof; return;
      case ' ': case '\r': case '\t': break;
      case '\n': line_++; seen_newline = true; break;
      case '{': case '}': case '(': case ')': case '[': case ']': return;
      case ',': case ':': case ';': case '=': return;
      case '.':
        if(!isdigit(*cursor_)) return;
        Error("floating point constant can\'t start with \".\"");
        break;
      case '\"':
        attribute_ = "";
        while (*cursor_ != '\"') {
          if (*cursor_ < ' ' && *cursor_ >= 0)
            Error("illegal character in string constant");
          if (*cursor_ == '\\') {
            cursor_++;
            switch (*cursor_) {
              case 'n':  attribute_ += '\n'; cursor_++; break;
              case 't':  attribute_ += '\t'; cursor_++; break;
              case 'r':  attribute_ += '\r'; cursor_++; break;
              case '\"': attribute_ += '\"'; cursor_++; break;
              case '\\': attribute_ += '\\'; cursor_++; break;
              default: Error("unknown escape code in string constant"); break;
            }
          } else { // printable chars + UTF-8 bytes
            attribute_ += *cursor_++;
          }
        }
        cursor_++;
        token_ = kTokenStringConstant;
        return;
      case '/':
        if (*cursor_ == '/') {
          const char *start = ++cursor_;
          while (*cursor_ && *cursor_ != '\n') cursor_++;
          if (*start == '/') {  // documentation comment
            if (!seen_newline)
              Error("a documentation comment should be on a line on its own");
            // todo: do we want to support multiline comments instead?
            doc_comment_ += std::string(start + 1, cursor_);
          }
          break;
        }
        // fall thru
      default:
        if (isalpha(static_cast<unsigned char>(c))) {
          // Collect all chars of an identifier:
          const char *start = cursor_ - 1;
          while (isalnum(static_cast<unsigned char>(*cursor_)) ||
                 *cursor_ == '_')
            cursor_++;
          attribute_.clear();
          attribute_.append(start, cursor_);
          // First, see if it is a type keyword from the table of types:
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
            if (attribute_ == IDLTYPE) { \
              token_ = kToken ## ENUM; \
              return; \
            }
            FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
          // If it's a boolean constant keyword, turn those into integers,
          // which simplifies our logic downstream.
          if (attribute_ == "true" || attribute_ == "false") {
            attribute_ = NumToString(attribute_ == "true");
            token_ = kTokenIntegerConstant;
            return;
          }
          // Check for declaration keywords:
          if (attribute_ == "table")     { token_ = kTokenTable;     return; }
          if (attribute_ == "struct")    { token_ = kTokenStruct;    return; }
          if (attribute_ == "enum")      { token_ = kTokenEnum;      return; }
          if (attribute_ == "union")     { token_ = kTokenUnion;     return; }
          if (attribute_ == "namespace") { token_ = kTokenNameSpace; return; }
          if (attribute_ == "root_type") { token_ = kTokenRootType;  return; }
          // If not, it is a user-defined identifier:
          token_ = kTokenIdentifier;
          return;
        } else if (isdigit(static_cast<unsigned char>(c)) || c == '-') {
          const char *start = cursor_ - 1;
          while (isdigit(static_cast<unsigned char>(*cursor_))) cursor_++;
          if (*cursor_ == '.') {
            cursor_++;
            while (isdigit(static_cast<unsigned char>(*cursor_))) cursor_++;
            token_ = kTokenFloatConstant;
          } else {
            token_ = kTokenIntegerConstant;
          }
          attribute_.clear();
          attribute_.append(start, cursor_);
          return;
        }
        std::string ch;
        ch = c;
        if (c < ' ' || c > '~') ch = "code: " + NumToString(c);
        Error("illegal character: " + ch);
        break;
    }
  }
}